

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O0

Inst * __thiscall mir::inst::LoadOffsetInst::deep_copy(LoadOffsetInst *this)

{
  Value *this_00;
  Value *in_RDI;
  Value *in_stack_ffffffffffffffc8;
  VarId *in_stack_ffffffffffffffd0;
  Value *in_stack_ffffffffffffffd8;
  LoadOffsetInst *in_stack_ffffffffffffffe0;
  
  this_00 = (Value *)operator_new(0x58);
  Value::Value(this_00,in_RDI);
  VarId::VarId((VarId *)this_00,(VarId *)in_RDI);
  Value::Value(this_00,in_RDI);
  LoadOffsetInst(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8);
  return (Inst *)this_00;
}

Assistant:

Inst* deep_copy() { return new LoadOffsetInst(src, dest, offset); }